

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_junit.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  GroupInfo *local_18;
  GroupInfo *groupInfo_local;
  JunitReporter *this_local;
  
  local_18 = groupInfo;
  groupInfo_local = (GroupInfo *)this;
  Timer::start(&this->suiteTimer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::__cxx11::ostringstream::str((string *)&this->stdOutForSuite);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::__cxx11::ostringstream::str((string *)&this->stdErrForSuite);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  this->unexpectedExceptions = 0;
  CumulativeReporterBase::testGroupStarting(&this->super_CumulativeReporterBase,local_18);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) {
            suiteTimer.start();
            stdOutForSuite.str("");
            stdErrForSuite.str("");
            unexpectedExceptions = 0;
            CumulativeReporterBase::testGroupStarting( groupInfo );
        }